

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.cc
# Opt level: O2

bool __thiscall ipx::SparseMatrix::IsSorted(SparseMatrix *this)

{
  int *piVar1;
  pointer piVar2;
  pointer piVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  
  piVar2 = (this->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (int)((ulong)((long)(this->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar2) >> 2) - 1;
  piVar3 = (this->rowidx_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = 0;
  uVar7 = 0;
  if (0 < (int)uVar5) {
    uVar7 = (ulong)uVar5;
  }
  for (; uVar6 != uVar7; uVar6 = uVar6 + 1) {
    lVar8 = (long)piVar2[uVar6];
    while (lVar8 < (long)piVar2[uVar6 + 1] + -1) {
      piVar1 = piVar3 + lVar8;
      lVar4 = lVar8 + 1;
      lVar8 = lVar8 + 1;
      if (piVar3[lVar4] < *piVar1) goto LAB_0038ba2a;
    }
  }
LAB_0038ba2a:
  return (long)(int)uVar5 <= (long)uVar6;
}

Assistant:

bool SparseMatrix::IsSorted() const {
    for (Int j = 0; j < cols(); j++) {
        for (Int p = begin(j); p < end(j)-1; p++)
            if (index(p) > index(p+1))
                return false;
    }
    return true;
}